

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

int __thiscall
AbstractModuleClient::processReplyMsg(AbstractModuleClient *this,string *repType,TrodesMsg *msg)

{
  bool bVar1;
  undefined1 uVar2;
  TrodesConfig *in_RDX;
  long *in_RDI;
  binarydata statedata;
  binarydata configdata;
  TrodesConfig newConfig;
  int timerate;
  uint32_t time;
  int rc;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  TrodesConfig *in_stack_fffffffffffffe40;
  TrodesConfig *this_00;
  TrodesConfig *this_01;
  MlmWrap *in_stack_fffffffffffffe50;
  string local_178 [32];
  TrodesConfig *in_stack_fffffffffffffea8;
  TrodesConfig *in_stack_fffffffffffffeb0;
  binarydata *in_stack_fffffffffffffed8;
  binarydata *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  TrodesMsg *in_stack_fffffffffffffef0;
  undefined1 local_f8 [127];
  allocator local_79;
  string local_78 [32];
  undefined4 local_58;
  string *in_stack_ffffffffffffffb0;
  AbstractModuleClient *in_stack_ffffffffffffffb8;
  string local_40 [32];
  undefined4 local_20;
  int local_1c;
  TrodesConfig *local_18;
  
  local_1c = 0;
  local_18 = in_RDX;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe40,
                          (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"4",(allocator *)&stack0xffffffffffffffbf);
    TrodesMsg::popcontents<unsigned_int>
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(uint *)in_stack_fffffffffffffee0
              );
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
    (**(code **)(*in_RDI + 0x70))(in_RDI,local_20);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe40,
                            (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"i",&local_79);
      TrodesMsg::popcontents<int>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (int *)in_stack_fffffffffffffee0);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      (**(code **)(*in_RDI + 0x78))(in_RDI,local_58);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe40,
                              (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38))
      ;
      if (bVar1) {
        TrodesConfig::TrodesConfig(in_stack_fffffffffffffe40);
        binarydata::binarydata((binarydata *)0x1c244c);
        binarydata::binarydata((binarydata *)0x1c245b);
        this_01 = (TrodesConfig *)&stack0xfffffffffffffee7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,"nn",(allocator *)this_01);
        TrodesMsg::popcontents<binarydata,binarydata>
                  (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
        TrodesConfig::decode
                  (local_18,(binarydata *)
                            CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
        uVar2 = TrodesConfig::isValid(this_01);
        this_00 = local_18;
        if ((bool)uVar2) {
          TrodesConfig::TrodesConfig(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          MlmWrap::setTrodesConfig(in_stack_fffffffffffffe50,this_01);
          TrodesConfig::~TrodesConfig(local_18);
          this_00 = local_18;
        }
        (**(code **)(*(long *)in_RDI[5] + 0x18))((long *)in_RDI[5],local_f8);
        network_pimpl::getTimestamp_endpoint_abi_cxx11_
                  ((network_pimpl *)CONCAT17(uVar2,in_stack_fffffffffffffe38));
        subToTimestamps(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        std::__cxx11::string::~string(local_178);
        binarydata::~binarydata((binarydata *)0x1c2650);
        binarydata::~binarydata((binarydata *)0x1c265d);
        TrodesConfig::~TrodesConfig(this_00);
      }
    }
  }
  return local_1c;
}

Assistant:

int AbstractModuleClient::processReplyMsg(std::string repType, TrodesMsg &msg) {
    int rc = 0;
    if (repType == INFO_TIME) {
        uint32_t time;
        msg.popcontents("4", time);
        recv_time(time);
    }
    else if (repType == INFO_TIMERATE) {
        int timerate;
        msg.popcontents("i", timerate);
        recv_timerate(timerate);
    }
    else if (repType == INFO_CONFIG) {
        TrodesConfig newConfig;
        binarydata configdata;
        binarydata statedata;
        msg.popcontents("nn", configdata, statedata);
        newConfig.decode(configdata);
        if(newConfig.isValid())
            setTrodesConfig(newConfig);

        state->decode(statedata);
        subToTimestamps(state->getTimestamp_endpoint());
    }
    // else {
    //     std::cout << "[AMC]: Reply type [" << repType << "] not recognized.\n";
    // }
    return rc;
}